

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

mat4 * lookat(vec3f eye,vec3f center,vec3f up)

{
  double dVar1;
  vec<3UL,_double> *pvVar2;
  double *pdVar3;
  vec<4UL,_double> *pvVar4;
  mat<4UL,_4UL> *in_RDI;
  int i;
  size_t i_00;
  vec3f z;
  vec3f y;
  vec3f x;
  double local_b8;
  vec3f local_a8;
  vec<3UL,_double> local_88;
  vec<3UL,_double> local_68;
  vec<3UL,_double> local_48;
  
  operator-(&local_48,(vec<3UL,_double> *)&stack0x00000008,(vec<3UL,_double> *)&z.z);
  pvVar2 = vec<3UL,_double>::normalize(&local_48);
  local_a8.x = pvVar2->x;
  local_a8.y = pvVar2->y;
  local_a8.z = pvVar2->z;
  cross((vec3f *)&stack0x00000038,&local_a8);
  pvVar2 = vec<3UL,_double>::normalize(&local_68);
  local_48.z = pvVar2->z;
  local_48.x = pvVar2->x;
  local_48.y = pvVar2->y;
  local_88.x = local_48.z * local_a8.y - local_a8.z * local_48.y;
  local_88.y = local_48.x * local_a8.z - local_a8.x * local_48.z;
  local_88.z = local_a8.x * local_48.y - local_48.x * local_a8.y;
  pvVar2 = vec<3UL,_double>::normalize(&local_88);
  local_68.x = pvVar2->x;
  local_68.y = pvVar2->y;
  local_68.z = pvVar2->z;
  mat<4UL,_4UL>::identity();
  for (i_00 = 0; i_00 != 3; i_00 = i_00 + 1) {
    pdVar3 = vec<3UL,_double>::operator[](&local_48,i_00);
    dVar1 = *pdVar3;
    pdVar3 = vec<4UL,_double>::operator[](in_RDI->rows,i_00);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[](&local_68,i_00);
    dVar1 = *pdVar3;
    pdVar3 = vec<4UL,_double>::operator[](in_RDI->rows + 1,i_00);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[](&local_a8,i_00);
    dVar1 = *pdVar3;
    pdVar3 = vec<4UL,_double>::operator[](in_RDI->rows + 2,i_00);
    *pdVar3 = dVar1;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)&z.z,i_00);
    local_b8 = -*pdVar3;
    pvVar4 = mat<4UL,_4UL>::operator[](in_RDI,i_00);
    pvVar4->data[3] = local_b8;
  }
  return in_RDI;
}

Assistant:

mat4 lookat(vec3f eye, vec3f center, vec3f up)
{
    vec3f z = (eye - center).normalize();
    vec3f x = cross(up, z).normalize();
    vec3f y = cross(z, x).normalize();
    mat4 ModelView = mat4::identity();
    for (int i = 0; i < 3; i++) {
        ModelView[0][i] = x[i];
        ModelView[1][i] = y[i];
        ModelView[2][i] = z[i];
        ModelView[i][3] = -center[i];
    }
    return ModelView;
}